

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

void directories::MADPCreateResultsDir(string *method,MultiAgentDecisionProcessInterface *problem)

{
  string local_30;
  
  (*problem->_vptr_MultiAgentDecisionProcessInterface[4])(&local_30);
  MADPCreateResultsDir(method,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
directories::MADPCreateResultsDir(const string & method,
                                  const MultiAgentDecisionProcessInterface
                                  &problem)
{
    return(MADPCreateResultsDir(method,problem.GetUnixName()));
}